

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

Vector<double,_6U> * OpenMD::operator*(RectMatrix<double,_6U,_6U> *m,Vector<double,_6U> *v)

{
  double dVar1;
  double *pdVar2;
  Vector<double,_6U> *in_RDX;
  RectMatrix<double,_6U,_6U> *in_RSI;
  Vector<double,_6U> *in_RDI;
  double dVar3;
  uint j;
  uint i;
  Vector<double,_6U> *result;
  undefined4 local_20;
  undefined4 local_1c;
  
  Vector<double,_6U>::Vector(in_RDI);
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
      dVar3 = RectMatrix<double,_6U,_6U>::operator()(in_RSI,local_1c,local_20);
      pdVar2 = Vector<double,_6U>::operator[](in_RDX,local_20);
      dVar1 = *pdVar2;
      pdVar2 = Vector<double,_6U>::operator[](in_RDI,local_1c);
      *pdVar2 = dVar3 * dVar1 + *pdVar2;
    }
  }
  return in_RDI;
}

Assistant:

inline Vector<Real, Row> operator*(const RectMatrix<Real, Row, Col>& m,
                                     const Vector<Real, Col>& v) {
    Vector<Real, Row> result;

    for (unsigned int i = 0; i < Row; i++)
      for (unsigned int j = 0; j < Col; j++)
        result[i] += m(i, j) * v[j];

    return result;
  }